

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_func_queue_examples.cpp
# Opt level: O1

void density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::
     func_queue_put_samples(ostream *i_ostream)

{
  put_transaction<Func> *ppVar1;
  undefined1 uVar2;
  bool bVar3;
  ostream *poVar4;
  void *pvVar5;
  long lVar6;
  undefined8 *puVar7;
  void *pvVar8;
  undefined4 uVar9;
  int iVar10;
  type return_value;
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue;
  double last_val;
  anon_class_8_1_90f47376 func;
  PrintScopeDuration dur;
  undefined1 local_f0 [40];
  __native_type local_c8;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
  local_a0;
  __native_type local_90;
  Func_conflict local_68;
  PrintScopeDuration local_58;
  
  PrintScopeDuration::PrintScopeDuration(&local_58,i_ostream,"function queue put samples");
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_tail = (ControlBlock *)&DAT_0000ffef;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_1_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_1_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(anon_class_1_0_00000001 *)local_f0);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_2_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_2_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(anon_class_1_0_00000001 *)local_f0);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_3_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_3_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(anon_class_1_0_00000001 *)local_f0);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_4_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_4_>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(anon_class_1_0_00000001 *)local_f0);
  do {
    bVar3 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_consume_impl((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                                *)&local_c8);
  } while (bVar3);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&local_c8.__data);
  local_68.m_string_1 = (char *)&local_90;
  local_90.__align = 0x3ff0000000000000;
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_tail = (ControlBlock *)&DAT_0000ffef;
  iVar10 = 10;
  do {
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,double()>,density::basic_default_allocator<65536ul>>
    ::
    emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_5_,density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::_lambda()_5_&>
              ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,double()>,density::basic_default_allocator<65536ul>>
                *)&local_c8.__data,(anon_class_8_1_90f47376 *)&local_68);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  do {
    density::
    conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::try_consume_impl((conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                        *)local_f0,&local_c8);
    uVar2 = local_f0[8];
    if (local_f0[8] == '\0') break;
    poVar4 = std::ostream::_M_insert<double>((double)local_f0._0_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  } while (uVar2 != '\0');
  density::
  conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&local_c8.__data);
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_a0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_f0._0_8_ = func_queue_put_samples::Struct::func_1;
  local_f0._8_8_ = 0;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(offset_in_Struct_to_subr *)local_f0);
  local_f0._0_8_ = func_queue_put_samples::Struct::func_2;
  local_f0._8_8_ = 0;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(offset_in_Struct_to_subr *)local_f0);
  local_f0._0_8_ = 0;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(offset_in_Struct_to_int *)local_f0);
  local_f0._0_8_ = 4;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(offset_in_Struct_to_int *)local_f0);
  local_f0._0_8_ = 0x400000003;
  iVar10 = 0;
  do {
    density::
    conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
    ::try_consume_impl((conc_function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                        *)&local_90,&local_c8,local_f0);
    uVar9 = 0;
    if (local_90.__size[4] != '\0') {
      uVar9 = local_90.__data.__lock;
    }
    iVar10 = iVar10 + uVar9;
  } while (local_90.__size[4] != '\0');
  if (iVar10 != 10) {
    __assert_fail("sum == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x5c,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
  ::destroy(&local_a0);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_f0._0_4_ = 7;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func,int>
            ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_c8.__data,(int *)local_f0);
  bVar3 = density::
          conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_consume_impl((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                              *)&local_c8);
  if (!bVar3) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x7e,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&local_c8.__data);
  local_c8._16_8_ = 0;
  local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c8.__align = 0;
  local_c8._8_8_ = 0;
  local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_a0.m_head = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_68.m_string_1 = (char *)0x0;
  local_68.m_string_2 = (char *)0x0;
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  start_push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
            ((put_transaction<typename_std::decay<Func>::type> *)&local_90.__data,&local_c8,
             &local_68);
  ppVar1 = (put_transaction<Func> *)(local_f0 + 0x10);
  local_f0._0_8_ = local_90.__align;
  local_90.__align = 0;
  local_90.__size[8] = '\0';
  local_f0._16_8_ = local_90._16_8_;
  local_f0._24_8_ = local_90.__data.__list.__prev;
  local_f0._32_8_ = local_90.__data.__list.__next;
  local_90._16_8_ = 0;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)&local_90.__data);
  pvVar5 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::raw_allocate(ppVar1,0xc,1);
  lVar6 = 0;
  do {
    *(char *)((long)pvVar5 + lVar6) = "Hello world"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xc);
  puVar7 = (undefined8 *)
           density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::element_ptr(ppVar1);
  *puVar7 = pvVar5;
  pvVar5 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::raw_allocate(ppVar1,0x12,1);
  lVar6 = 0;
  do {
    *(char *)((long)pvVar5 + lVar6) = "\t(I\'m so happy)!!"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x12);
  pvVar8 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::element_ptr(ppVar1);
  *(void **)((long)pvVar8 + 8) = pvVar5;
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::commit((put_transaction<Func> *)local_f0);
  bVar3 = density::
          conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_consume_impl((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                              *)&local_c8);
  if (bVar3) {
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)local_f0);
    density::
    conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::~conc_function_queue
              ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&local_c8.__data);
    local_c8._16_8_ = 0;
    local_c8.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_c8.__align = 0;
    local_c8._8_8_ = 0;
    local_c8.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_a0.m_head = (ControlBlock *)&DAT_0000ffef;
    local_a0.m_tail = (ControlBlock *)&DAT_0000ffef;
    density::
    conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
    ::
    start_emplace<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Func>
              ((put_transaction<Func> *)&local_90.__data,&local_c8);
    ppVar1 = (put_transaction<Func> *)(local_f0 + 0x10);
    local_f0._0_8_ = local_90.__align;
    local_f0[8] = local_90.__size[8];
    local_90.__align = 0;
    local_90.__size[8] = '\0';
    local_f0._16_8_ = local_90._16_8_;
    local_f0._24_8_ = local_90.__data.__list.__prev;
    local_f0._32_8_ = local_90.__data.__list.__next;
    local_90._16_8_ = 0;
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)&local_90.__data);
    pvVar5 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::put_transaction<Func>::raw_allocate(ppVar1,0xc,1);
    lVar6 = 0;
    do {
      *(char *)((long)pvVar5 + lVar6) = "Hello world"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xc);
    puVar7 = (undefined8 *)
             density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::put_transaction<Func>::element_ptr(ppVar1);
    *puVar7 = pvVar5;
    pvVar5 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::put_transaction<Func>::raw_allocate(ppVar1,0x12,1);
    lVar6 = 0;
    do {
      *(char *)((long)pvVar5 + lVar6) = "\t(I\'m so happy)!!"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x12);
    pvVar8 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::put_transaction<Func>::element_ptr(ppVar1);
    *(void **)((long)pvVar8 + 8) = pvVar5;
    density::
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::put_transaction<Func>::commit((put_transaction<Func> *)local_f0);
    bVar3 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_consume_impl((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                                *)&local_c8);
    if (bVar3) {
      density::
      conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::put_transaction<Func>::~put_transaction((put_transaction<Func> *)local_f0);
      density::
      conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
      ::~conc_function_queue
                ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                  *)&local_c8.__data);
      PrintScopeDuration::~PrintScopeDuration(&local_58);
      return;
    }
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0xb8,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  __assert_fail("invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                ,0x9b,
                "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
               );
}

Assistant:

static void func_queue_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "function queue put samples");

            using namespace density;

            {
                //! [conc_function_queue push example 1]
                conc_function_queue<void(), default_allocator, ERASURE> queue;
                queue.push([] { std::cout << "Hello"; });
                queue.push([] { std::cout << " world"; });
                queue.push([] { std::cout << "!!!"; });
                queue.push([] { std::cout << std::endl; });
                while (queue.try_consume())
                    ;
                //! [conc_function_queue push example 1]
            }
            {
                //! [conc_function_queue push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                conc_function_queue<double(), default_allocator, ERASURE> queue;
                for (int i = 0; i < 10; i++)
                    queue.push(func);

                while (auto const return_value = queue.try_consume())
                    std::cout << *return_value << std::endl;
                //! [conc_function_queue push example 2]
            }
            {
                //! [conc_function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64) /* the size of a type must always be a multiple of
        the alignment, but in the Microsoft's compiler, on 64-bit targets, pointers to data
        member are 4 bytes big, but are aligned to 8 bytes.

        Test code:
            using T = int Struct::*;
            std::cout << sizeof(T) << std::endl;
            std::cout << alignof(T) << std::endl;
        */

                struct Struct
                {
                    int func_1() { return 1; }
                    int func_2() { return 2; }
                    int var_1 = 3;
                    int var_2 = 4;
                };

                conc_function_queue<int(Struct *)> queue;
                queue.push(&Struct::func_1);
                queue.push(&Struct::func_2);
                queue.push(&Struct::var_1);
                queue.push(&Struct::var_2);

                Struct struct_instance;

                int sum = 0;
                while (auto const return_value = queue.try_consume(&struct_instance))
                    sum += *return_value;
                assert(sum == 10);

#endif
//! [conc_function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64)
                (void)sum;
#endif
            }
            {
                //! [conc_function_queue emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                queue.template emplace<Func>(7);

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue emplace example 1]
                (void)invoked;
            }
            {
                //! [conc_function_queue start_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                auto transaction = queue.start_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue start_push example 1]
                (void)invoked;
            }
            {
                //! [conc_function_queue start_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                conc_function_queue<void(), default_allocator, ERASURE> queue;
                auto transaction = queue.template start_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [conc_function_queue start_emplace example 1]
                (void)invoked;
            }
        }